

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool wallet::GetWalletNameFromJSONRPCRequest(JSONRPCRequest *request,string *wallet_name)

{
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  long in_FS_OFFSET;
  __sv_type _Var3;
  string_view in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff90 [16];
  char *__n;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff90._8_8_);
  __n = _Var3._M_str;
  __x._M_len._7_1_ = in_stack_ffffffffffffffc7;
  __x._M_len._0_7_ = in_stack_ffffffffffffffc0;
  __x._M_str = in_stack_ffffffffffffffc8;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(in_stack_ffffffffffffff90._8_8_,__x);
  if (bVar2) {
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                      (in_stack_ffffffffffffff90._8_8_);
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var3._M_str;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_stack_ffffffffffffff78);
    std::basic_string_view<char,_std::char_traits<char>_>::substr
              (in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_,(size_type)__n);
    UrlDecode_abi_cxx11_(in_stack_00000010);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffd8,__str);
    std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool GetWalletNameFromJSONRPCRequest(const JSONRPCRequest& request, std::string& wallet_name)
{
    if (request.URI.starts_with(WALLET_ENDPOINT_BASE)) {
        // wallet endpoint was used
        wallet_name = UrlDecode(std::string_view{request.URI}.substr(WALLET_ENDPOINT_BASE.size()));
        return true;
    }
    return false;
}